

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereBoxCollisionAlgorithm.h
# Opt level: O0

void __thiscall
btSphereBoxCollisionAlgorithm::getAllContactManifolds
          (btSphereBoxCollisionAlgorithm *this,btManifoldArray *manifoldArray)

{
  btPersistentManifold **in_RDI;
  btAlignedObjectArray<btPersistentManifold_*> *unaff_retaddr;
  
  if ((in_RDI[3] != (btPersistentManifold *)0x0) && (((ulong)in_RDI[2] & 1) != 0)) {
    btAlignedObjectArray<btPersistentManifold_*>::push_back(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

virtual	void	getAllContactManifolds(btManifoldArray&	manifoldArray)
	{
		if (m_manifoldPtr && m_ownManifold)
		{
			manifoldArray.push_back(m_manifoldPtr);
		}
	}